

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O3

void TestEncoderVelocity(BasePort *port,AmpIO *board,MotionTrajectory *motion)

{
  pointer ppMVar1;
  double dVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  int32_t iVar6;
  uint32_t uVar7;
  ostream *poVar8;
  ulong uVar9;
  pointer ppVar10;
  ofstream *poVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  pointer ppVar15;
  uint uVar16;
  char *pcVar17;
  EncData *pEVar18;
  EncData *pEVar19;
  undefined8 *puVar20;
  char cVar21;
  pointer pEVar22;
  EncData *pEVar23;
  int iVar24;
  EncData *pEVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  pointer ppVar29;
  byte bVar30;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar31;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar32;
  undefined4 uVar33;
  vector<EncData,_std::allocator<EncData>_> measuredData;
  EncData encData;
  double raccel;
  double rvel;
  double rpos;
  double vel;
  double accel;
  double pos;
  ofstream outFile;
  quadlet_t waveform [1024];
  undefined1 local_1318 [16];
  vector<EncData,_std::allocator<EncData>_> local_1308;
  MotionTrajectory *local_12e8;
  uint local_12dc;
  double local_12d8;
  EncData local_12d0;
  double local_1268;
  double local_1260;
  double local_1258;
  double local_1250;
  double local_1248;
  double local_1240;
  long local_1238;
  filebuf local_1230 [240];
  ios_base local_1140 [264];
  quadlet_t local_1038 [1026];
  
  bVar30 = 0;
  (*(board->super_FpgaIO).super_BoardIO._vptr_BoardIO[10])(board);
  uVar5 = MotionTrajectory::CreateWaveform
                    (motion,local_1038,0x400,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),1,1
                    );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Writing waveform table with ",0x1c);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," entries",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  bVar4 = AmpIO::WriteWaveformTable(board,local_1038,0,(unsigned_short)uVar5);
  if (bVar4) {
    bVar4 = MotionTrajectory::GetValuesAtTime(motion,0.0,&local_1240,&local_1250,&local_1248);
    if (bVar4) {
      local_12e8 = motion;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Initializing encoders (about 6 seconds)",0x27);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      bVar4 = local_1250 < 0.0;
      AmpIO::WriteDigitalOutput(board,'\x03',!bVar4 * '\x02');
      Amp1394_Sleep(1.4);
      AmpIO::WriteDigitalOutput(board,'\x03',bVar4 * '\x02');
      Amp1394_Sleep(1.4);
      AmpIO::WriteDigitalOutput(board,'\x03',bVar4 * '\x02' + '\x01');
      Amp1394_Sleep(1.4);
      AmpIO::WriteDigitalOutput(board,'\x03',!bVar4 * '\x02' + '\x01');
      Amp1394_Sleep(1.4);
      uVar5 = 0;
      do {
        AmpIO::WriteEncoderPreload(board,uVar5,0);
        uVar5 = uVar5 + 1;
      } while (uVar5 != 4);
      Amp1394_Sleep(0.05);
      (*port->_vptr_BasePort[0x1d])(port);
      uVar5 = 0;
      iVar6 = AmpIO::GetEncoderPosition(board,0);
      if (iVar6 != 0) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"WriteEncoderPreload: retrying (pos = ",0x25);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          AmpIO::WriteEncoderPreload(board,0,0);
          Amp1394_Sleep(0.05);
          (*port->_vptr_BasePort[0x1d])(port);
          iVar6 = AmpIO::GetEncoderPosition(board,0);
          if (iVar6 == 0) break;
          bVar4 = uVar5 < 4;
          uVar5 = uVar5 + 1;
        } while (bVar4);
        if (iVar6 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Failed to preload encoder",0x19);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
          goto LAB_001074f1;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Starting position = ",0x14);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", velocity = ",0xd);
      dVar2 = AmpIO::GetEncoderVelocity(board,0);
      poVar8 = std::ostream::_M_insert<double>(dVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", acceleration = ",0x11);
      dVar2 = AmpIO::GetEncoderAcceleration(board,0,1.0);
      poVar8 = std::ostream::_M_insert<double>(dVar2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Running test",0xc);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      local_1308.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
      super__Vector_impl_data._M_start = (EncData *)0x0;
      local_1308.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
      super__Vector_impl_data._M_finish = (EncData *)0x0;
      local_1308.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (EncData *)0x0;
      ppMVar1 = (local_12e8->motionList).
                super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppMVar1 ==
          (local_12e8->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        uVar31 = 0;
        uVar32 = 0;
      }
      else {
        dVar2 = ppMVar1[-1]->tf;
        uVar31 = SUB84(dVar2,0);
        uVar32 = (undefined4)((ulong)dVar2 >> 0x20);
      }
      dVar2 = (double)CONCAT44(uVar32,uVar31) / 0.0005;
      uVar9 = (ulong)dVar2;
      std::vector<EncData,_std::allocator<EncData>_>::reserve
                (&local_1308,(long)(dVar2 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9);
      EncoderVelocity::Init(&local_12d0.encVelData.super_EncoderVelocity);
      local_12d0.mpos = 0;
      AmpIO::WriteWaveformControl(board,'\x03','\x03');
      uVar5 = 1;
      while ((uVar5 != 0 || (local_12d0.mpos == 0))) {
        (*port->_vptr_BasePort[0x1d])(port);
        uVar7 = AmpIO::GetDigitalInput(board);
        if ((uVar7 & 0x20000000) != 0) {
          local_12d0.mpos = AmpIO::GetEncoderPosition(board,0);
          local_12d0.mvel = AmpIO::GetEncoderVelocity(board,0);
          local_12d0.mvelpred = AmpIO::GetEncoderVelocityPredicted(board,0,1.0);
          local_12d0.maccel = AmpIO::GetEncoderAcceleration(board,0,1.0);
          local_12d0.run = AmpIO::GetEncoderRunningCounterSeconds(board,0);
          local_12d0.ts = AmpIO::GetTimestampSeconds(board);
          bVar4 = AmpIO::GetEncoderVelocityData
                            (board,0,&local_12d0.encVelData.super_EncoderVelocity);
          if (!bVar4) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"GetEncoderVelocityData failed",0x1d);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
            std::ostream::put(-0x18);
            std::ostream::flush();
          }
          if (local_1308.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_1308.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<EncData,std::allocator<EncData>>::_M_realloc_insert<EncData_const&>
                      ((vector<EncData,std::allocator<EncData>> *)&local_1308,
                       (iterator)
                       local_1308.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_12d0);
          }
          else {
            pEVar18 = &local_12d0;
            pEVar22 = local_1308.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            for (lVar12 = 0xd; lVar12 != 0; lVar12 = lVar12 + -1) {
              uVar31 = *(undefined4 *)&pEVar18->field_0x4;
              pEVar22->mpos = pEVar18->mpos;
              *(undefined4 *)&pEVar22->field_0x4 = uVar31;
              pEVar18 = (EncData *)((long)pEVar18 + (ulong)bVar30 * -0x10 + 8);
              pEVar22 = (EncData *)((long)pEVar22 + (ulong)bVar30 * -0x10 + 8);
            }
            local_1308.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_1308.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        uVar5 = (uVar7 & 0x20000000) >> 0x1d;
        Amp1394_Sleep(0.0005);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Read ",5);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," samples",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      ppVar10 = (local_12e8->encList).
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar15 = (local_12e8->encList).
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      iVar24 = 0;
      if (ppVar15 != ppVar10) {
        iVar24 = ppVar10->second;
      }
      if (local_1308.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_1308.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar26 = 1;
        uVar9 = 0;
        local_12dc = 0;
        local_1318 = ZEXT816(0);
        local_12d8 = 0.0;
        pEVar18 = local_1308.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pEVar25 = local_1308.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        do {
          pEVar19 = pEVar18 + uVar9;
          pEVar23 = &local_12d0;
          for (lVar12 = 0xd; lVar12 != 0; lVar12 = lVar12 + -1) {
            uVar31 = *(undefined4 *)&pEVar19->field_0x4;
            pEVar23->mpos = pEVar19->mpos;
            *(undefined4 *)&pEVar23->field_0x4 = uVar31;
            pEVar19 = (EncData *)((long)pEVar19 + (ulong)bVar30 * -0x10 + 8);
            pEVar23 = (EncData *)((long)pEVar23 + ((ulong)bVar30 * -2 + 1) * 8);
          }
          local_12d8 = local_12d8 + local_12d0.ts;
          if (local_12d0.mpos != iVar24) {
            uVar28 = uVar26;
            if (uVar26 < (ulong)((long)ppVar15 - (long)ppVar10 >> 4)) {
              iVar27 = ppVar10[uVar26].second;
              if (local_12d0.mpos != iVar27) {
LAB_001078f6:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Unexpected encoder position: ",0x1d);
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_12d0.mpos);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,", expecting ",0xc);
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar27);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8," (index = ",10);
                poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                std::ostream::put((char)poVar8);
                std::ostream::flush();
                ppVar10 = (local_12e8->encList).
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                ppVar15 = (local_12e8->encList).
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                uVar13 = (long)ppVar15 - (long)ppVar10 >> 4;
                pEVar18 = local_1308.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pEVar25 = local_1308.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                iVar24 = local_12d0.mpos;
                if ((uVar26 < uVar13) && (uVar5 = iVar27 - local_12d0.mpos, uVar5 != 0)) {
                  uVar16 = -uVar5;
                  if (0 < (int)uVar5) {
                    uVar16 = uVar5;
                  }
                  lVar12 = uVar26 << 4;
                  do {
                    uVar5 = *(int *)((long)&ppVar10->second + lVar12) - local_12d0.mpos;
                    if (uVar5 == 0) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"Found match at index ",0x15);
                      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8)
                      ;
                      std::ostream::put((char)poVar8);
                      std::ostream::flush();
                      ppVar10 = (local_12e8->encList).
                                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      ppVar15 = (local_12e8->encList).
                                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                      if ((ulong)((long)ppVar15 - (long)ppVar10 >> 4) <= uVar28) goto LAB_00107a90;
                      ppVar29 = (pointer)((long)&ppVar10->first + lVar12);
                      goto LAB_00107a86;
                    }
                    uVar3 = -uVar5;
                    if (0 < (int)uVar5) {
                      uVar3 = uVar5;
                    }
                    uVar28 = uVar28 + 1;
                  } while ((uVar28 < uVar13) &&
                          (lVar12 = lVar12 + 0x10, bVar4 = uVar3 <= uVar16, uVar16 = uVar3, bVar4));
                }
                goto LAB_00107ae6;
              }
              ppVar29 = ppVar10 + uVar26;
LAB_00107a86:
              uVar31 = SUB84(ppVar29->first,0);
              uVar32 = (undefined4)((ulong)ppVar29->first >> 0x20);
            }
            else {
              iVar27 = 0;
              if (local_12d0.mpos != 0) goto LAB_001078f6;
LAB_00107a90:
              uVar31 = 0;
              uVar32 = 0xbff00000;
            }
            uVar26 = uVar28 + 1;
            pEVar18 = local_1308.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pEVar25 = local_1308.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            iVar24 = local_12d0.mpos;
            if (((0.0 <= (double)CONCAT44(uVar32,uVar31) && (double)CONCAT44(uVar32,uVar31) != 0.0)
                && (local_12d0.encVelData.super_EncoderVelocity.runOverflow == false)) &&
               (uVar26 < 10)) {
              uVar33 = local_1318._12_4_;
              local_1318._8_4_ = local_1318._8_4_;
              local_1318._0_8_ =
                   local_1318._0_8_ +
                   (local_12d8 - ((double)CONCAT44(uVar32,uVar31) + local_12d0.run));
              local_1318._12_4_ = uVar33;
              local_12dc = local_12dc + 1;
            }
          }
LAB_00107ae6:
          uVar9 = uVar9 + 1;
        } while (uVar9 < (ulong)(((long)pEVar25 - (long)pEVar18 >> 3) * 0x4ec4ec4ec4ec4ec5));
        if (local_12dc != 0) {
          local_1318._0_8_ = (double)local_1318._0_8_ / (double)local_12dc;
          goto LAB_00107b35;
        }
      }
      local_1318 = ZEXT816(0);
LAB_00107b35:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Time offset = ",0xe)
      ;
      poVar8 = std::ostream::_M_insert<double>((double)local_1318._0_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," (",2);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," samples)",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      std::ofstream::ofstream(&local_1238,"waveform.csv",_S_trunc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1238,
                 "time, mpos, mvel, mvelpred, maccel, run, rpos, rvel, raccel, ts, velper, qtr1, qtr5, flags"
                 ,0x5a);
      std::ios::widen((char)(ostream *)&local_1238 + (char)*(undefined8 *)(local_1238 + -0x18));
      cVar21 = (char)(ofstream *)&local_1238;
      std::ostream::put(cVar21);
      std::ostream::flush();
      if (local_1308.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_1308.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_1318._0_8_ = local_1318._0_8_ ^ 0x8000000000000000;
        local_1318._12_4_ = local_1318._12_4_ ^ 0x80000000;
        lVar12 = 0;
        uVar9 = 0;
        do {
          puVar20 = (undefined8 *)
                    ((long)&(local_1308.super__Vector_base<EncData,_std::allocator<EncData>_>.
                             _M_impl.super__Vector_impl_data._M_start)->mpos + lVar12);
          pEVar18 = &local_12d0;
          for (lVar14 = 0xd; lVar14 != 0; lVar14 = lVar14 + -1) {
            *(undefined8 *)pEVar18 = *puVar20;
            puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
            pEVar18 = (EncData *)((long)pEVar18 + ((ulong)bVar30 * -2 + 1) * 8);
          }
          uVar31 = local_1318._12_4_;
          dVar2 = local_1318._0_8_ + local_12d0.ts;
          local_1318._8_4_ = local_1318._8_4_;
          local_1318._0_8_ = dVar2;
          local_1318._12_4_ = uVar31;
          bVar4 = MotionTrajectory::GetValuesAtTime
                            (local_12e8,dVar2,&local_1258,&local_1260,&local_1268);
          if (bVar4) {
            poVar8 = std::ostream::_M_insert<double>(dVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,local_12d0.mpos);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
            poVar8 = std::ostream::_M_insert<double>(local_12d0.mvel);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
            poVar8 = std::ostream::_M_insert<double>(local_12d0.mvelpred);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
            poVar8 = std::ostream::_M_insert<double>(local_12d0.maccel);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
            poVar8 = std::ostream::_M_insert<double>(local_12d0.run);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
            poVar8 = std::ostream::_M_insert<double>(local_1258);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
            poVar8 = std::ostream::_M_insert<double>(local_1260);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
            poVar8 = std::ostream::_M_insert<double>(local_1268);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
            poVar8 = std::ostream::_M_insert<double>(local_12d0.ts);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
            EncoderVelocityLocal::PrintFlags(&local_12d0.encVelData,(ofstream *)&local_1238);
            std::ios::widen((char)*(undefined8 *)(local_1238 + -0x18) + cVar21);
            poVar11 = (ofstream *)&local_1238;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"GetValuesAtTime failed for time = ",0x22);
            poVar11 = (ofstream *)std::ostream::_M_insert<double>(dVar2);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          }
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          uVar9 = uVar9 + 1;
          lVar12 = lVar12 + 0x68;
        } while (uVar9 < (ulong)(((long)local_1308.
                                        super__Vector_base<EncData,_std::allocator<EncData>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_1308.
                                        super__Vector_base<EncData,_std::allocator<EncData>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 3) *
                                0x4ec4ec4ec4ec4ec5));
      }
      local_1238 = _VTT;
      *(undefined8 *)(local_1230 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
      std::filebuf::~filebuf(local_1230);
      std::ios_base::~ios_base(local_1140);
      if (local_1308.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
          super__Vector_impl_data._M_start == (EncData *)0x0) {
        return;
      }
      operator_delete(local_1308.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1308.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_1308.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl
                            .super__Vector_impl_data._M_start);
      return;
    }
    pcVar17 = "TestEncoderVelocity: failed to get initial values";
    lVar12 = 0x31;
  }
  else {
    pcVar17 = "WriteWaveformTable failed";
    lVar12 = 0x19;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar17,lVar12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
LAB_001074f1:
  std::ostream::put(-0x18);
  std::ostream::flush();
  return;
}

Assistant:

void TestEncoderVelocity(BasePort *port, AmpIO *board, MotionTrajectory &motion)
{
    const int WLEN = 1024;
    const int testAxis = 0;   // All axes should be the same when using test board
    quadlet_t waveform[WLEN];
    double dt = board->GetFPGAClockPeriod();

    unsigned int numEntries = motion.CreateWaveform(waveform, WLEN, dt);

    std::cout << "Writing waveform table with " << numEntries << " entries" << std::endl;
    if (!board->WriteWaveformTable(waveform, 0, numEntries)) {
        std::cout << "WriteWaveformTable failed" << std::endl;
        return;
    }

    double pos, vel, accel;
    if (!motion.GetValuesAtTime(0.0, pos, vel, accel)) {
        std::cout << "TestEncoderVelocity: failed to get initial values" << std::endl;
        return;
    }
    std::cout << "Initializing encoders (about 6 seconds)" << std::endl;
    // Initial movements to initialize firmware
    // Wait long enough for encoder period to overflow
    if (vel >= 0) {
        board->WriteDigitalOutput(0x03, 0x02);
        Amp1394_Sleep(1.4);
        board->WriteDigitalOutput(0x03, 0x00);
        Amp1394_Sleep(1.4);
        board->WriteDigitalOutput(0x03, 0x01);
        Amp1394_Sleep(1.4);
        board->WriteDigitalOutput(0x03, 0x03);
        Amp1394_Sleep(1.4);
    }
    else {
        board->WriteDigitalOutput(0x03, 0x00);
        Amp1394_Sleep(1.4);
        board->WriteDigitalOutput(0x03, 0x02);
        Amp1394_Sleep(1.4);
        board->WriteDigitalOutput(0x03, 0x03);
        Amp1394_Sleep(1.4);
        board->WriteDigitalOutput(0x03, 0x01);
        Amp1394_Sleep(1.4);
    }

    // Initialize encoder position
    unsigned int i;
    for (i = 0; i < 4; i++)
        board->WriteEncoderPreload(i, 0);

    Amp1394_Sleep(0.05);
    port->ReadAllBoards();
    int startPos = board->GetEncoderPosition(testAxis);
    // Sometimes, position is non-zero after preload
    for (i = 0; (i < 5) && (startPos != 0); i++) {
        std::cout << "WriteEncoderPreload: retrying (pos = " << startPos << ")" << std::endl;
        board->WriteEncoderPreload(testAxis, 0);
        Amp1394_Sleep(0.05);
        port->ReadAllBoards();
        startPos = board->GetEncoderPosition(testAxis);
    }
    if (startPos != 0) {
        std::cout << "Failed to preload encoder" << std::endl;
        return;
    }
    std::cout << "Starting position = " << startPos
              << ", velocity = " << board->GetEncoderVelocity(testAxis)
              << ", acceleration = " << board->GetEncoderAcceleration(testAxis) << std::endl;
    std::cout << "Running test" << std::endl;

    std::vector<EncData> measuredData;
    // Estimate data size
    const double loopTime = 0.0005;  // Loop time in seconds (~2 kHz)
    double tf, pf, vf, af;
    motion.GetFinalValues(tf, pf, vf, af);
    // Overestimates datasize because the actual loop time will be less than loopTime.
    size_t dataSize = static_cast<size_t>(tf/loopTime);
    measuredData.reserve(dataSize);

    EncData encData;
    encData.mpos = 0;
    bool waveform_active = true;

    // Start waveform on DOUT1 and DOUT2 (to produce EncA and EncB using test board)
    board->WriteWaveformControl(0x03, 0x03);

    // Collect the data, storing it in measuredData
    while (waveform_active || (encData.mpos == 0)) {
        port->ReadAllBoards();
        waveform_active = board->GetDigitalInput()&0x20000000;
        if (waveform_active) {
            encData.mpos = board->GetEncoderPosition(testAxis);
            encData.mvel = board->GetEncoderVelocity(testAxis);
            encData.mvelpred = board->GetEncoderVelocityPredicted(testAxis);
            encData.maccel = board->GetEncoderAcceleration(testAxis);
            encData.run = board->GetEncoderRunningCounterSeconds(testAxis);
            encData.ts = board->GetTimestampSeconds();
            if (!board->GetEncoderVelocityData(testAxis, encData.encVelData))
                std::cout << "GetEncoderVelocityData failed" << std::endl;
            measuredData.push_back(encData);
        }
        Amp1394_Sleep(loopTime);
    }
    std::cout << "Read " << measuredData.size() << " samples" << std::endl;

    // Synchronize time
    // Time as measured by FPGA (accumulated timestamp values)
    double clkTime = 0.0;

    // Reference encoder position
    int epos = motion.GetEncoderEventPosition(0);
    size_t curIndex = 1;

    // For computing mean time difference
    double sumDiff = 0.0;
    unsigned int numDiff = 0;

    size_t dataIndex;
    for (dataIndex = 0; dataIndex < measuredData.size(); dataIndex++) {
        encData = measuredData[dataIndex];
        clkTime += encData.ts;
        // Find mpos in encoder list
        if (encData.mpos != epos) {
            double rtime = 0.0;
            epos = motion.GetEncoderEventPosition(curIndex);
            if (encData.mpos == epos) {
                rtime = motion.GetEncoderEventTime(curIndex);
                curIndex++;
            }
            else {
                std::cout << "Unexpected encoder position: " << encData.mpos << ", expecting " << epos
                          << " (index = " << curIndex << ")" << std::endl;
                size_t testIndex;
                int testPos = epos;
                unsigned int lastDiff = abs(epos-encData.mpos);
                unsigned int curDiff = lastDiff;
                for (testIndex = curIndex; (testIndex < motion.GetNumEncoderEvents()) && (curDiff != 0)
                         && (curDiff <= lastDiff) ; testIndex++) {
                    testPos = motion.GetEncoderEventPosition(testIndex);
                    lastDiff = curDiff;
                    curDiff = abs(testPos-encData.mpos);
                    if (curDiff == 0) {
                        std::cout << "Found match at index " << testIndex << std::endl;
                        rtime = motion.GetEncoderEventTime(testIndex);
                        curIndex = testIndex+1;
                    }
                }
                epos = encData.mpos;
            }
            // For now, consider first few encoder transitions when computing time difference
            if ((rtime > 0.0) && (!encData.encVelData.IsRunningCounterOverflow()) && (curIndex < 10)) {
                double timeDiff = clkTime-(rtime+encData.run);
                sumDiff += timeDiff;
                numDiff++;
            }
            epos = encData.mpos;
        }
    }
    double tOffset = 0.0;
    if (numDiff > 0)
        tOffset = sumDiff/numDiff;
    std::cout << "Time offset = " << tOffset << " (" << numDiff << " samples)" << std::endl;

    // Output data to file
    std::ofstream outFile("waveform.csv", std::ios_base::trunc);
    outFile << "time, mpos, mvel, mvelpred, maccel, run, rpos, rvel, raccel, ts, velper, qtr1, qtr5, flags" << std::endl;

    clkTime = -tOffset;
    for (dataIndex = 0; dataIndex < measuredData.size(); dataIndex++) {
        encData = measuredData[dataIndex];
        clkTime += encData.ts;
        double rpos, rvel, raccel;
        if (motion.GetValuesAtTime(clkTime, rpos, rvel, raccel)) {
            outFile << clkTime << ", " << encData.mpos << ", " << encData.mvel << ", " << encData.mvelpred << ", " << encData.maccel << ", "
                    << encData.run << ", " << rpos << ", " << rvel << ", " << raccel << ", " << encData.ts << ", "
                    << encData.encVelData.GetEncoderVelocityPeriod() << ", "
                    << encData.encVelData.GetEncoderQuarter1Period() << ", "
                    << encData.encVelData.GetEncoderQuarter5Period() << ", ";
            encData.encVelData.PrintFlags(outFile);
            outFile << std::endl;
        }
        else
            std::cout << "GetValuesAtTime failed for time = " << clkTime << std::endl;
    }
}